

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O3

void __thiscall
dgMeshEffect::GetFaces(dgMeshEffect *this,HaI32 *facesIndex,HaI32 *materials,void **faceNodeList)

{
  double dVar1;
  dgTreeNode *this_00;
  undefined1 auVar2 [16];
  long lVar3;
  int iVar4;
  int iVar5;
  dgRedBackNode *pdVar6;
  int iVar7;
  Iterator local_40;
  
  iVar5 = (this->super_dgPolyhedra).m_edgeMark + 1;
  (this->super_dgPolyhedra).m_edgeMark = iVar5;
  local_40.m_tree = (dgTree<dgEdge,_long> *)this;
  if (iVar5 == 0x7fffffff) {
    __assert_fail("m_edgeMark < 0x7fffffff",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.h"
                  ,0xe5,"hacd::HaI32 dgPolyhedra::IncLRU() const");
  }
  this_00 = (this->super_dgPolyhedra).super_dgTree<dgEdge,_long>.m_head;
  if (this_00 != (dgTreeNode *)0x0) {
    local_40.m_ptr = dgRedBackNode::Minimum(&this_00->super_dgRedBackNode);
    if (local_40.m_ptr != (dgRedBackNode *)0x0) {
      iVar4 = 0;
      iVar7 = 0;
      do {
        if ((*(int *)&local_40.m_ptr[2]._vptr_dgRedBackNode != iVar5) &&
           (-1 < *(int *)((long)&local_40.m_ptr[1]._vptr_dgRedBackNode + 4))) {
          lVar3 = 0;
          pdVar6 = local_40.m_ptr + 1;
          do {
            if ((pdVar6[-1].field_0x20 & 2) == 0) {
              __assert_fail("retnode->IsInTree ()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgTree.h"
                            ,0x193,
                            "typename dgTree<OBJECT, KEY>::dgTreeNode *dgTree<dgEdge, long>::GetNodeFromInfo(OBJECT &) const [OBJECT = dgEdge, KEY = long]"
                           );
            }
            faceNodeList[iVar7 + lVar3] = pdVar6 + -1;
            *(int *)&pdVar6[1]._vptr_dgRedBackNode = iVar5;
            lVar3 = lVar3 + 1;
            pdVar6 = pdVar6->m_right;
          } while (pdVar6 != local_40.m_ptr + 1);
          iVar7 = iVar7 + (int)lVar3;
          facesIndex[iVar4] = (int)lVar3;
          dVar1 = (double)this->m_attib[*(int *)&local_40.m_ptr[1].m_left].m_material;
          auVar2 = vcvtdq2pd_avx(ZEXT416((uint)(int)dVar1));
          materials[iVar4] = (int)dVar1 - (uint)(dVar1 < auVar2._0_8_);
          iVar4 = iVar4 + 1;
        }
        dgTree<dgEdge,_long>::Iterator::operator++(&local_40,0);
      } while (local_40.m_ptr != (dgRedBackNode *)0x0);
    }
  }
  return;
}

Assistant:

void dgMeshEffect::GetFaces (hacd::HaI32* const facesIndex, hacd::HaI32* const materials, void** const faceNodeList) const
{
	Iterator iter (*this);

	hacd::HaI32 faces = 0;
	hacd::HaI32 indexCount = 0;
	hacd::HaI32 mark = IncLRU();
	for (iter.Begin(); iter; iter ++) {
		dgEdge* const edge = &(*iter);
		if (edge->m_mark == mark) {
			continue;
		}

		if (edge->m_incidentFace < 0) {
			continue;
		}

		hacd::HaI32 faceCount = 0;
		dgEdge* ptr = edge;
		do {
//			indexList[indexCount] = hacd::HaI32 (ptr->m_userData);
			faceNodeList[indexCount] = GetNodeFromInfo (*ptr);
			indexCount ++;
			faceCount ++;
			ptr->m_mark = mark;
			ptr = ptr->m_next;
		} while (ptr != edge);

		facesIndex[faces] = faceCount;
		materials[faces] = dgFastInt(m_attib[hacd::HaI32 (edge->m_userData)].m_material);
		faces ++;
	}
}